

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

void duckdb::NumericStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  PhysicalType PVar1;
  InternalException *this;
  string local_60;
  string local_40;
  
  PVar1 = (stats->type).physical_type_;
  switch(PVar1) {
  case BOOL:
    return;
  case UINT8:
    TemplatedVerify<unsigned_char>(stats,vector,sel,count);
    return;
  case INT8:
    TemplatedVerify<signed_char>(stats,vector,sel,count);
    return;
  case UINT16:
    TemplatedVerify<unsigned_short>(stats,vector,sel,count);
    return;
  case INT16:
    TemplatedVerify<short>(stats,vector,sel,count);
    return;
  case UINT32:
    TemplatedVerify<unsigned_int>(stats,vector,sel,count);
    return;
  case INT32:
    TemplatedVerify<int>(stats,vector,sel,count);
    return;
  case UINT64:
    TemplatedVerify<unsigned_long>(stats,vector,sel,count);
    return;
  case INT64:
    TemplatedVerify<long>(stats,vector,sel,count);
    return;
  case UINT64|UINT8:
    goto switchD_0176b0f7_caseD_a;
  case FLOAT:
    TemplatedVerify<float>(stats,vector,sel,count);
    return;
  case DOUBLE:
    TemplatedVerify<double>(stats,vector,sel,count);
    return;
  default:
    if (PVar1 == UINT128) {
      TemplatedVerify<duckdb::uhugeint_t>(stats,vector,sel,count);
      return;
    }
    if (PVar1 == INT128) {
      TemplatedVerify<duckdb::hugeint_t>(stats,vector,sel,count);
      return;
    }
switchD_0176b0f7_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Unsupported type %s for numeric statistics verify","");
    LogicalType::ToString_abi_cxx11_(&local_40,&stats->type);
    InternalException::InternalException<std::__cxx11::string>
              (this,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

void NumericStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &type = stats.GetType();
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		break;
	case PhysicalType::INT8:
		TemplatedVerify<int8_t>(stats, vector, sel, count);
		break;
	case PhysicalType::INT16:
		TemplatedVerify<int16_t>(stats, vector, sel, count);
		break;
	case PhysicalType::INT32:
		TemplatedVerify<int32_t>(stats, vector, sel, count);
		break;
	case PhysicalType::INT64:
		TemplatedVerify<int64_t>(stats, vector, sel, count);
		break;
	case PhysicalType::UINT8:
		TemplatedVerify<uint8_t>(stats, vector, sel, count);
		break;
	case PhysicalType::UINT16:
		TemplatedVerify<uint16_t>(stats, vector, sel, count);
		break;
	case PhysicalType::UINT32:
		TemplatedVerify<uint32_t>(stats, vector, sel, count);
		break;
	case PhysicalType::UINT64:
		TemplatedVerify<uint64_t>(stats, vector, sel, count);
		break;
	case PhysicalType::INT128:
		TemplatedVerify<hugeint_t>(stats, vector, sel, count);
		break;
	case PhysicalType::UINT128:
		TemplatedVerify<uhugeint_t>(stats, vector, sel, count);
		break;
	case PhysicalType::FLOAT:
		TemplatedVerify<float>(stats, vector, sel, count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedVerify<double>(stats, vector, sel, count);
		break;
	default:
		throw InternalException("Unsupported type %s for numeric statistics verify", type.ToString());
	}
}